

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall Am_Object::Text_Inspect(Am_Object *this,Am_Slot_Key key)

{
  ostream *poVar1;
  Am_Slot_Data *slot_00;
  Am_Slot_Data *slot;
  Am_Slot_Key key_local;
  Am_Object *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"\nFor Object ");
  poVar1 = ::operator<<(poVar1,this);
  poVar1 = std::operator<<(poVar1," (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->data);
  std::operator<<(poVar1,")\n");
  if (this->data == (Am_Object_Data *)0x0) {
    std::operator<<((ostream *)&std::cout,"  ** Object is not Valid\n");
  }
  else {
    slot_00 = Am_Object_Data::find_slot(this->data,key);
    std::operator<<((ostream *)&std::cout,"  Slot ");
    Am_Object_Data::print_slot_name_and_value(this->data,key,slot_00);
  }
  std::ostream::operator<<(&std::cout,std::flush<char,std::char_traits<char>>);
  return;
}

Assistant:

void
Am_Object::Text_Inspect(Am_Slot_Key key) const
{
  std::cout << "\nFor Object " << *this << " (" << (void *)data << ")\n";
  if (data) {
    Am_Slot_Data *slot = data->find_slot(key);
    std::cout << "  Slot ";
    data->print_slot_name_and_value(key, slot);
  } else
    std::cout << "  ** Object is not Valid\n";
  std::cout << std::flush;
}